

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sig.c
# Opt level: O2

int sigMain(int argc,char **argv)

{
  int iVar1;
  err_t eVar2;
  bool_t bVar3;
  err_t code;
  size_t sVar4;
  octet *privkey;
  int iVar5;
  char *pcVar6;
  char **ppcVar7;
  char **ppcVar8;
  char *pcVar9;
  cmd_pwd_t pwd;
  char *local_48;
  size_t local_40;
  octet date [6];
  
  if (argc < 2) {
    printf("bee2cmd/%s: %s\nUsage:\n  sig sign [options] <privkey> <file>\n    sign <file> using <privkey> and attach signature\n  sig sign [options] <privkey> <file> <sig>\n    sign <file> using <privkey> and store signature in <sig>\n  sig val {-pubkey <pubkey>|-anchor <anchor>} <file>\n    verify signature attached to <file> using <pubkey> or <anchor>\n  sig val {-pubkey <pubkey>|-anchor <anchor>} <file> <sig>\n    verify <sig> of <file> using <pubkey> or <anchor>\n  sig extr {-cert<n>|-body|-sig} <sig> <obj_file>\n    extract object from <sig> and store it in <obj_file>\n      -cert<n> -- <n>th attached certificate\n        \\remark certificates are numbered from zero\n        \\remark signing certificate comes last\n      -body -- signed body\n      -sig -- signature itself\n  sig print [field] <sig>\n    print <sig> info: all fields or a specific field\n  .\n  <privkey>\n    container with private key\n  <pubkey>\n    file with public key\n  <anchor>\n    file with trusted certificate\n  options:\n    -certs <certs> -- certificate chain (optional)\n    -date <YYMMDD> -- date of signing (optional)\n    -pass <schema> -- password description\n  field:\n    {-certc|-date|-sig}\n      -certc -- number of attached certificates\n      -date -- date of signing\n      -sig -- base signature\n"
           ,"sig","sign files and verify signatures");
    return -1;
  }
  iVar5 = -1;
  iVar1 = strCmp(argv[1],"sign");
  if (iVar1 == 0) {
    pwd = (cmd_pwd_t)0x0;
    code = cmdStDo(8);
    if (code == 0) {
      local_48 = (char *)0x0;
      memSet(date,'\0',6);
      ppcVar8 = argv;
      do {
        iVar1 = argc + -3;
        ppcVar7 = ppcVar8;
        while( true ) {
          ppcVar8 = ppcVar7 + 2;
          if ((iVar1 == -1) || (bVar3 = strStartsWith(*ppcVar8,"-"), bVar3 == 0)) {
            code = 0x25b;
            if ((iVar1 - 3U < 0xfffffffe) || (pwd == (cmd_pwd_t)0x0)) goto LAB_0010bfb2;
            iVar1 = iVar1 + 1;
            eVar2 = 0;
            goto LAB_0010bf49;
          }
          if (iVar1 + 3U < 4) {
            code = 0x25b;
            goto LAB_0010bfb2;
          }
          bVar3 = strStartsWith(*ppcVar8,"-certs");
          if (bVar3 != 0) break;
          bVar3 = strStartsWith(*ppcVar8,"-date");
          if (bVar3 == 0) {
            bVar3 = strStartsWith(*ppcVar8,"-pass");
            if (bVar3 == 0) {
              eVar2 = 0x25b;
              goto LAB_0010bf46;
            }
            if (pwd != (cmd_pwd_t)0x0) goto LAB_0010bf07;
            eVar2 = cmdPwdRead(&pwd,ppcVar7[3]);
          }
          else {
            bVar3 = memIsZero(date,6);
            if (bVar3 == 0) {
LAB_0010bf07:
              eVar2 = 0x25c;
LAB_0010bf46:
              iVar1 = iVar1 + 1;
              goto LAB_0010bf49;
            }
            eVar2 = cmdDateParse(date,ppcVar7[3]);
          }
          if (eVar2 != 0) {
            ppcVar8 = ppcVar7 + 3;
            goto LAB_0010bf49;
          }
          iVar1 = iVar1 + -2;
          ppcVar7 = ppcVar8;
        }
        if (local_48 != (char *)0x0) goto LAB_0010c08b;
        argc = iVar1 + 1;
        local_48 = ppcVar7[3];
      } while( true );
    }
  }
  else {
    iVar1 = strCmp(argv[1],"val");
    if (iVar1 == 0) {
      code = cmdStDo(8);
      if (((code != 0) || (code = 0x25b, argc - 7U < 0xfffffffe)) ||
         ((iVar1 = strCmp(argv[2],"-pubkey"), iVar1 != 0 &&
          (iVar1 = strCmp(argv[2],"-anchor"), iVar1 != 0)))) goto LAB_0010bfbc;
      if (argc == 6) {
        bVar3 = cmdFileAreSame(argv[4],argv[5]);
        code = 0xd3;
        if (bVar3 != 0) goto LAB_0010bfbc;
      }
      ppcVar8 = argv + 3;
      code = cmdFileValExist(argc + -3,ppcVar8);
      if ((code != 0) || (code = cmdFileReadAll((void *)0x0,(size_t *)&pwd,*ppcVar8), code != 0))
      goto LAB_0010bfbc;
      privkey = (octet *)blobCreate((size_t)pwd);
      if (privkey == (octet *)0x0) goto LAB_0010c082;
      code = cmdFileReadAll(privkey,(size_t *)&pwd,*ppcVar8);
      if (code == 0) {
        iVar1 = strCmp(argv[2],"-pubkey");
        pcVar9 = argv[4];
        if (iVar1 == 0) {
          pcVar6 = pcVar9;
          if (argc == 6) {
            pcVar6 = argv[5];
          }
          code = cmdSigVerify(pcVar9,pcVar6,privkey,(size_t)pwd);
        }
        else {
          pcVar6 = pcVar9;
          if (argc == 6) {
            pcVar6 = argv[5];
          }
          code = cmdSigVerify2(pcVar9,pcVar6,privkey,(size_t)pwd);
        }
      }
LAB_0010c0b5:
      blobClose(privkey);
    }
    else {
      iVar1 = strCmp(argv[1],"extr");
      if (iVar1 == 0) {
        code = 0x25b;
        if (argc != 5) goto LAB_0010bfc1;
        pcVar9 = argv[2];
        sVar4 = strLen(pcVar9);
        if ((sVar4 == 0) || (*pcVar9 != '-')) goto LAB_0010bfc1;
        code = cmdFileValExist(1,argv + 3);
        if (code != 0) goto LAB_0010bfc1;
        code = cmdFileValNotExist(1,argv + 4);
        if (code != 0) goto LAB_0010bfc1;
        code = cmdSigExtr(argv[4],argv[3],pcVar9 + 1);
      }
      else {
        iVar1 = strCmp(argv[1],"print");
        code = 0x259;
        if ((iVar1 != 0) || (code = 0x25b, argc - 5U < 0xfffffffe)) goto LAB_0010bfc1;
        ppcVar8 = argv + 2;
        if (argc == 4) {
          pcVar9 = *ppcVar8;
          sVar4 = strLen(pcVar9);
          if ((sVar4 == 0) || (*pcVar9 != '-')) goto LAB_0010bfc1;
          pcVar9 = pcVar9 + 1;
          ppcVar8 = argv + 3;
        }
        else {
          pcVar9 = (char *)0x0;
        }
        code = cmdFileValExist(1,ppcVar8);
        if (code != 0) goto LAB_0010bfc1;
        code = cmdSigPrint(*ppcVar8,pcVar9);
      }
    }
  }
  goto LAB_0010bfbc;
LAB_0010c08b:
  iVar1 = iVar1 + 1;
  eVar2 = 0x25c;
LAB_0010bf49:
  if (iVar1 == 3) {
    bVar3 = cmdFileAreSame(ppcVar8[1],ppcVar8[2]);
    code = 0xd3;
    if (bVar3 == 0) goto LAB_0010bf66;
  }
  else {
LAB_0010bf66:
    code = eVar2;
    if (((eVar2 == 0) && (code = cmdFileValExist(2,ppcVar8), code == 0)) &&
       ((iVar1 != 3 || (code = cmdFileValNotExist(1,ppcVar8 + 2), code == 0)))) {
      local_40 = 0;
      code = cmdPrivkeyRead((octet *)0x0,&local_40,*ppcVar8,pwd);
      if (code == 0) {
        privkey = (octet *)blobCreate(local_40);
        if (privkey != (octet *)0x0) {
          code = cmdPrivkeyRead(privkey,(size_t *)0x0,*ppcVar8,pwd);
          cmdPwdClose(pwd);
          if (code == 0) {
            code = cmdSigSign(ppcVar8[(ulong)(iVar1 == 3) + 1],ppcVar8[1],local_48,date,privkey,
                              local_40);
          }
          goto LAB_0010c0b5;
        }
        cmdPwdClose(pwd);
LAB_0010c082:
        code = 0x6e;
        goto LAB_0010bfbc;
      }
    }
  }
LAB_0010bfb2:
  cmdPwdClose(pwd);
LAB_0010bfbc:
  if (code == 0) {
    iVar1 = strCmp(argv[1],"val");
    iVar5 = 0;
    code = 0;
    if (iVar1 != 0) {
      return 0;
    }
  }
LAB_0010bfc1:
  pcVar9 = errMsg(code);
  printf("bee2cmd/%s: %s\n","sig",pcVar9);
  return iVar5;
}

Assistant:

static int sigMain(int argc, char* argv[])
{
	err_t code;
	// справка
	if (argc < 2)
		return sigUsage();
	// разбор команды
	--argc, ++argv;
	if (strEq(argv[0], "sign"))
		code = sigSign(argc - 1, argv + 1);
	else if (strEq(argv[0], "val"))	
		code = sigVal(argc - 1, argv + 1);
	else if (strEq(argv[0], "extr"))
		code = sigExtr(argc - 1, argv + 1);
	else if (strEq(argv[0], "print"))
		code = sigPrint(argc - 1, argv + 1);
	else
		code = ERR_CMD_NOT_FOUND;
	// завершить
	if (code != ERR_OK || strEq(argv[0], "val"))
		printf("bee2cmd/%s: %s\n", _name, errMsg(code));
	return code != ERR_OK ? -1 : 0;
}